

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isIntegral(Value *this)

{
  bool bVar1;
  double dVar2;
  double integral_part;
  double dStack_8;
  
  bVar1 = true;
  if (1 < (byte)this->field_0x8 - 1) {
    if (this->field_0x8 != 3) {
      return false;
    }
    dVar2 = (this->value_).real_;
    bVar1 = false;
    if ((-9.223372036854776e+18 <= dVar2) && (dVar2 < 1.8446744073709552e+19)) {
      dStack_8 = 0.0;
      dVar2 = modf(dVar2,&dStack_8);
      bVar1 = (bool)(-(dVar2 == 0.0) & 1);
    }
  }
  return bVar1;
}

Assistant:

bool Value::isIntegral() const {
  switch (type_) {
    case intValue:
    case uintValue:
      return true;
    case realValue:
#if defined(JSON_HAS_INT64)
      // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
      // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
      // require the value to be strictly less than the limit.
      return value_.real_ >= double(minInt64) && value_.real_ < maxUInt64AsDouble && IsIntegral(value_.real_);
#else
      return value_.real_ >= minInt && value_.real_ <= maxUInt && IsIntegral(value_.real_);
#endif // JSON_HAS_INT64
    default:
      break;
  }
  return false;
}